

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

DescriptorMap *
Memory::
AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
          (Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  DescriptorMap *pDVar1;
  DescriptorMap *pDVar2;
  
  if (AllocFunc == 0) {
    Recycler::ClearTrackAllocInfo(allocator,(TrackAllocData *)0x0);
    pDVar1 = (DescriptorMap *)0x8;
  }
  else {
    pDVar1 = (DescriptorMap *)
             new__<Memory::Recycler>
                       (-(ulong)(AllocFunc >> 0x3a != 0) | AllocFunc * 0x40,allocator,0x37ff80);
    pDVar2 = pDVar1;
    do {
      (pDVar2->propRecord).ptr = (PropertyRecord *)0x0;
      Js::PropertyDescriptor::PropertyDescriptor(&pDVar2->descriptor);
      (pDVar2->originalVar).ptr = (void *)0x0;
      pDVar2 = pDVar2 + 1;
    } while (pDVar2 != pDVar1 + AllocFunc);
  }
  return pDVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}